

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O0

int TestInit4DOM(char *xmlFile,bool gDoNamespaces,bool gDoSchema,bool gSchemaFullChecking,
                Teststate theState)

{
  bool bVar1;
  XercesDOMParser *this;
  ostream *this_00;
  ulong uVar2;
  undefined7 in_register_00000031;
  OutOfMemoryException *anon_var_0;
  XMLException *toCatch;
  DOMException *toCatch_1;
  undefined1 local_78 [7];
  bool errorOccurred;
  InitTermTestErrorHandler errorHandler;
  XercesDOMParser *parser;
  XMLException *toCatch_3;
  XMLException *toCatch_2;
  long local_30;
  long i;
  long times;
  Teststate theState_local;
  bool gSchemaFullChecking_local;
  bool gDoSchema_local;
  bool gDoNamespaces_local;
  char *xmlFile_local;
  
  uVar2 = CONCAT71(in_register_00000031,gDoNamespaces);
  if (theState != Once) {
    if (theState - Multiple < 2) {
      i = 100;
      goto LAB_00104445;
    }
    if (theState - Limit < 2) {
      i = 0x7fffffffffffffff;
      goto LAB_00104445;
    }
  }
  i = 1;
LAB_00104445:
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    uVar2 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  if (theState == ExceedLimit) {
    uVar2 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,uVar2);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  errorHandler._8_8_ = this;
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(SUB81(this,0));
  xercesc_4_0::AbstractDOMParser::setDoSchema(errorHandler.fSawErrors);
  xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(errorHandler.fSawErrors);
  xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(errorHandler.fSawErrors);
  InitTermTestErrorHandler::InitTermTestErrorHandler((InitTermTestErrorHandler *)local_78);
  xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)errorHandler._8_8_);
  InitTermTestErrorHandler::resetErrors((InitTermTestErrorHandler *)local_78);
  xercesc_4_0::AbstractDOMParser::parse((char *)errorHandler._8_8_);
  bVar1 = InitTermTestErrorHandler::getSawErrors((InitTermTestErrorHandler *)local_78);
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cout,"\nErrors occurred, no output available\n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  if (errorHandler._8_8_ != 0) {
    (**(code **)(*(long *)errorHandler._8_8_ + 8))();
  }
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  if ((theState == ExceedLimit) || (theState == UnEven)) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  if (bVar1) {
    xmlFile_local._4_4_ = 4;
  }
  else {
    xmlFile_local._4_4_ = 0;
  }
  InitTermTestErrorHandler::~InitTermTestErrorHandler((InitTermTestErrorHandler *)local_78);
  return xmlFile_local._4_4_;
}

Assistant:

int TestInit4DOM(const char* xmlFile, bool gDoNamespaces, bool gDoSchema, bool gSchemaFullChecking, Teststate theState)
{
    TESTINITPRE;
    XercesDOMParser* parser = new XercesDOMParser;
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    TESTINITPOST;
}